

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer)

{
  long *plVar1;
  uint uVar2;
  FieldDescriptor *pFVar3;
  SCCAnalyzer *pSVar4;
  bool bVar5;
  Type TVar6;
  MessageAnalysis MVar7;
  pointer ppFVar8;
  Descriptor *pDVar9;
  SCC *pSVar10;
  LogMessage *pLVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar12;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *pFVar13;
  char *pcVar14;
  long lVar15;
  bool bVar16;
  ulong uVar17;
  Hex hex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks;
  undefined1 local_e0 [56];
  long local_a8;
  string local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  LogMessage local_68;
  
  io::Printer::Print(printer,"bool $classname$::IsInitialized() const {\n","classname",
                     &this->classname_);
  io::Printer::Indent(printer);
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    io::Printer::Print(printer,"if (!_extensions_.IsInitialized()) {\n  return false;\n}\n\n");
  }
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
    RequiredFieldsBitMask(&local_80,this);
    if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar17 = 0;
      uVar12 = extraout_RDX;
      do {
        uVar2 = local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17];
        if ((ulong)uVar2 != 0) {
          SimpleItoa_abi_cxx11_((string *)local_e0,(protobuf *)(uVar17 & 0xffffffff),(int)uVar12);
          hex._8_8_ = 8;
          hex.value = (ulong)uVar2;
          strings::AlphaNum::AlphaNum((AlphaNum *)&local_68,hex);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,local_68._0_8_,local_68.filename_ + local_68._0_8_);
          io::Printer::Print(printer,"if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n"
                             ,"i",(string *)local_e0,"mask",&local_a0);
          uVar12 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            uVar12 = extraout_RDX_01;
          }
          if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
            operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
            uVar12 = extraout_RDX_02;
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < (ulong)((long)local_80.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_80.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2));
    }
    if (local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  ppFVar8 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar8) {
    uVar17 = 0;
    do {
      pFVar3 = ppFVar8[uVar17];
      TVar6 = FieldDescriptor::type(pFVar3);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4) == 10) {
        pSVar4 = this->scc_analyzer_;
        pDVar9 = FieldDescriptor::message_type(pFVar3);
        pSVar10 = SCCAnalyzer::GetSCC(pSVar4,pDVar9);
        MVar7 = SCCAnalyzer::GetSCCAnalysis(pSVar4,pSVar10);
        if (((uint)MVar7 & 0x1010000) != 0) {
          if (*(int *)(pFVar3 + 0x4c) == 3) {
            FieldName_abi_cxx11_((string *)local_e0,(cpp *)pFVar3,field);
            io::Printer::Print(printer,
                               "if (!::google::protobuf::internal::AllAreInitialized(this->$name$())) return false;\n"
                               ,"name",(string *)local_e0);
          }
          else {
            if (*(char *)(*(long *)(pFVar3 + 0x80) + 0x6f) != '\0') goto LAB_0025c8c3;
            pFVar13 = field;
            if (*(long *)(pFVar3 + 0x60) != 0) {
              internal::LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0x10b6);
              pLVar11 = internal::LogMessage::operator<<
                                  (&local_68,"CHECK failed: !field->containing_oneof(): ");
              internal::LogFinisher::operator=((LogFinisher *)local_e0,pLVar11);
              internal::LogMessage::~LogMessage(&local_68);
              pFVar13 = extraout_RDX_03;
            }
            FieldName_abi_cxx11_((string *)local_e0,(cpp *)pFVar3,pFVar13);
            io::Printer::Print(printer,
                               "if (has_$name$()) {\n  if (!this->$name$_->IsInitialized()) return false;\n}\n"
                               ,"name",(string *)local_e0);
          }
          if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
            operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
          }
        }
      }
LAB_0025c8c3:
      uVar17 = uVar17 + 1;
      ppFVar8 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(this->optimized_order_).
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8 >> 3)
            );
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"if (!_weak_field_map_.IsInitialized()) return false;\n");
  }
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x38)) {
    lVar15 = 0;
    do {
      plVar1 = (long *)(*(long *)(pDVar9 + 0x40) + lVar15 * 0x30);
      local_a8 = lVar15;
      if (*(int *)(*(long *)(pDVar9 + 0x40) + 0x1c + lVar15 * 0x30) < 1) {
        bVar16 = false;
      }
      else {
        lVar15 = 0;
        bVar16 = false;
        do {
          pFVar3 = *(FieldDescriptor **)(plVar1[4] + lVar15 * 8);
          TVar6 = FieldDescriptor::type(pFVar3);
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4) == 10) {
            pSVar4 = this->scc_analyzer_;
            pDVar9 = FieldDescriptor::message_type(pFVar3);
            pSVar10 = SCCAnalyzer::GetSCC(pSVar4,pDVar9);
            MVar7 = SCCAnalyzer::GetSCCAnalysis(pSVar4,pSVar10);
            if (((uint)MVar7 & 0x1010000) == 0) goto LAB_0025c997;
            bVar16 = true;
            bVar5 = false;
          }
          else {
LAB_0025c997:
            bVar5 = true;
          }
        } while ((bVar5) && (lVar15 = lVar15 + 1, lVar15 < *(int *)((long)plVar1 + 0x1c)));
      }
      if (bVar16) {
        io::Printer::Print(printer,"switch ($oneofname$_case()) {\n","oneofname",(string *)*plVar1);
        io::Printer::Indent(printer);
        if (0 < *(int *)((long)plVar1 + 0x1c)) {
          lVar15 = 0;
          do {
            pFVar3 = *(FieldDescriptor **)(plVar1[4] + lVar15 * 8);
            UnderscoresToCamelCase((string *)local_e0,*(string **)pFVar3,true);
            io::Printer::Print(printer,"case k$field_name$: {\n","field_name",(string *)local_e0);
            if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
              operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
            }
            io::Printer::Indent(printer);
            TVar6 = FieldDescriptor::type(pFVar3);
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar6 * 4) == 10) {
              pSVar4 = this->scc_analyzer_;
              pDVar9 = FieldDescriptor::message_type(pFVar3);
              pSVar10 = SCCAnalyzer::GetSCC(pSVar4,pDVar9);
              MVar7 = SCCAnalyzer::GetSCCAnalysis(pSVar4,pSVar10);
              if (((uint)MVar7 & 0x1010000) != 0) {
                if ((*(char *)(*(long *)(pFVar3 + 0x80) + 0x6f) != '\0') ||
                   (pFVar13 = extraout_RDX_04, *(long *)(pFVar3 + 0x60) == 0)) {
                  internal::LogMessage::LogMessage
                            ((LogMessage *)local_e0,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                             ,0x10e6);
                  pLVar11 = internal::LogMessage::operator<<
                                      ((LogMessage *)local_e0,
                                       "CHECK failed: !(field->options().weak() || !field->containing_oneof()): "
                                      );
                  internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar11);
                  internal::LogMessage::~LogMessage((LogMessage *)local_e0);
                  pFVar13 = extraout_RDX_05;
                }
                if (*(char *)(*(long *)(pFVar3 + 0x80) + 0x6f) == '\0') {
                  FieldName_abi_cxx11_((string *)local_e0,(cpp *)pFVar3,pFVar13);
                  io::Printer::Print(printer,
                                     "if (has_$name$()) {\n  if (!this->$name$().IsInitialized()) return false;\n}\n"
                                     ,"name",(string *)local_e0);
                  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
                    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
                  }
                }
              }
            }
            io::Printer::Print(printer,"break;\n");
            io::Printer::Outdent(printer);
            io::Printer::Print(printer,"}\n");
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)((long)plVar1 + 0x1c));
        }
        local_e0._0_8_ = local_e0 + 0x10;
        lVar15 = *(long *)*plVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e0,lVar15,((long *)*plVar1)[1] + lVar15);
        if ((char *)local_e0._8_8_ != (char *)0x0) {
          pcVar14 = (char *)0x0;
          do {
            if ((byte)(*(char *)(local_e0._0_8_ + (long)pcVar14) + 0x9fU) < 0x1a) {
              *(char *)(local_e0._0_8_ + (long)pcVar14) =
                   *(char *)(local_e0._0_8_ + (long)pcVar14) + -0x20;
            }
            pcVar14 = pcVar14 + 1;
          } while ((char *)local_e0._8_8_ != pcVar14);
        }
        io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n",
                           "cap_oneof_name",(string *)local_e0);
        if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
          operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
        }
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
      }
      lVar15 = local_a8 + 1;
      pDVar9 = this->descriptor_;
    } while (lVar15 < *(int *)(pDVar9 + 0x38));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  return true;\n}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateIsInitialized(io::Printer* printer) {
  printer->Print(
    "bool $classname$::IsInitialized() const {\n",
    "classname", classname_);
  printer->Indent();

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "if (!_extensions_.IsInitialized()) {\n"
      "  return false;\n"
      "}\n\n");
  }

  if (HasFieldPresence(descriptor_->file())) {
    // Check that all required fields in this message are set.  We can do this
    // most efficiently by checking 32 "has bits" at a time.
    const std::vector<uint32> masks = RequiredFieldsBitMask();

    for (int i = 0; i < masks.size(); i++) {
      uint32 mask = masks[i];
      if (mask == 0) {
        continue;
      }

      // TODO(ckennelly): Consider doing something similar to ByteSizeLong(),
      // where we check all of the required fields in a single branch (assuming
      // that we aren't going to benefit from early termination).
      printer->Print(
        "if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n",
        "i", SimpleItoa(i),
        "mask", StrCat(strings::Hex(mask, strings::ZERO_PAD_8)));
    }
  }

  // Now check that all non-oneof embedded messages are initialized.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];
    // TODO(ckennelly): Push this down into a generator?
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !ShouldIgnoreRequiredFieldCheck(field, options_) &&
        scc_analyzer_->HasRequiredFields(field->message_type())) {
      if (field->is_repeated()) {
        printer->Print(
          "if (!::google::protobuf::internal::AllAreInitialized(this->$name$()))"
          " return false;\n",
          "name", FieldName(field));
      } else if (field->options().weak()) {
        continue;
      } else {
        GOOGLE_CHECK(!field->containing_oneof());
        printer->Print(
            "if (has_$name$()) {\n"
            "  if (!this->$name$_->IsInitialized()) return false;\n"
            "}\n",
            "name", FieldName(field));
      }
    }
  }
  if (num_weak_fields_) {
    // For Weak fields.
    printer->Print("if (!_weak_field_map_.IsInitialized()) return false;\n");
  }
  // Go through the oneof fields, emitting a switch if any might have required
  // fields.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);

    bool has_required_fields = false;
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);

      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
          !ShouldIgnoreRequiredFieldCheck(field, options_) &&
          scc_analyzer_->HasRequiredFields(field->message_type())) {
        has_required_fields = true;
        break;
      }
    }

    if (!has_required_fields) {
      continue;
    }

    printer->Print(
        "switch ($oneofname$_case()) {\n",
        "oneofname", oneof->name());
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();

      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
          !ShouldIgnoreRequiredFieldCheck(field, options_) &&
          scc_analyzer_->HasRequiredFields(field->message_type())) {
        GOOGLE_CHECK(!(field->options().weak() || !field->containing_oneof()));
        if (field->options().weak()) {
          // Just skip.
        } else {
          printer->Print(
            "if (has_$name$()) {\n"
            "  if (!this->$name$().IsInitialized()) return false;\n"
            "}\n",
            "name", FieldName(field));
        }
      }

      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(oneof->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }

  printer->Outdent();
  printer->Print(
    "  return true;\n"
    "}\n");
}